

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

put_transaction<void> * __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::start_dyn_push_copy
          (put_transaction<void> *__return_storage_ptr__,
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          *this,runtime_type *i_type,void *i_source)

{
  size_t i_size;
  size_t i_alignment;
  put_transaction<void> local_80;
  runtime_type<> *local_50;
  runtime_type<> *type_storage;
  runtime_type *type;
  Allocation push_data;
  void *i_source_local;
  runtime_type *i_type_local;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  *this_local;
  
  push_data.m_user_storage = i_source;
  i_size = runtime_type<>::size(i_type);
  i_alignment = runtime_type<>::alignment(i_type);
  detail::
  LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
            ((Allocation *)&type,
             (LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
              *)this,1,true,i_size,i_alignment);
  type_storage = (runtime_type<> *)0x0;
  local_50 = detail::
             LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
             ::type_after_control((ControlBlock *)type);
  local_50->m_feature_table = i_type->m_feature_table;
  type_storage = local_50;
  runtime_type<>::copy_construct(i_type,(void *)push_data.m_next_ptr,push_data.m_user_storage);
  put_transaction<void>::put_transaction(&local_80,0,this,(Allocation *)&type);
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
  ::put_transaction<void>::put_transaction<void,void>
            ((put_transaction<void> *)__return_storage_ptr__,&local_80);
  put_transaction<void>::~put_transaction(&local_80);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<> start_dyn_push_copy(const runtime_type & i_type, const void * i_source)
        {
            auto push_data = Base::template try_inplace_allocate_impl<detail::LfQueue_Throwing>(
              detail::LfQueue_Busy, true, i_type.size(), i_type.alignment());

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.copy_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<void>(PrivateType(), this, push_data);
        }